

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O1

bool ApplicativeHelper::isComb(TermList head)

{
  if ((head._content & 1) == 0) {
    return *(int *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0x60) +
                             (ulong)*(uint *)(head._content + 8) * 8) + 0x48) != 5;
  }
  return false;
}

Assistant:

bool ApplicativeHelper::isComb(const TermList head)
{
  if(head.isVar()){ return false; }
  return env.signature->getFunction(head.term()->functor())->combinator() != Signature::NOT_COMB;
}